

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O3

MPP_RET h265d_parse(void *ctx,HalDecTask *task)

{
  HalDecTaskFlag *pHVar1;
  HEVCContext *s;
  HalDecTask *pHVar2;
  RK_S32 RVar3;
  
  s = *ctx;
  task->valid = 0;
  s->got_frame = 0;
  s->task = task;
  s->ref = (HEVCFrame *)0x0;
  RVar3 = parser_nal_units(s);
  if (RVar3 < 0) {
    if (RVar3 == -0x3ec) {
      _mpp_log_l(4,"H265D_PARSER","current stream is no right skip it %p\n",(char *)0x0,s->ref);
    }
    *(byte *)&task->flags = *(byte *)&task->flags | 4;
  }
  if (((byte)h265d_debug & 0x40) != 0) {
    _mpp_log_l(4,"H265D_PARSER","decode poc = %d",(char *)0x0,(ulong)(uint)s->poc);
  }
  if (s->ref != (HEVCFrame *)0x0) {
    if (((ulong)task->flags & 4) == 0) {
      h265d_parser2_syntax(ctx);
    }
    pHVar2 = s->task;
    (pHVar2->syntax).data = s->hal_pic_private;
    (pHVar2->syntax).number = 1;
    pHVar2->valid = 1;
    s->ps_need_upate = '\0';
  }
  if (s->eos != 0) {
    do {
      RVar3 = mpp_hevc_output_frame(*ctx,(int)*(undefined8 *)((long)ctx + 0x50));
    } while (RVar3 != 0);
    pHVar1 = &s->task->flags;
    pHVar1->val = pHVar1->val | 1;
  }
  s->nb_frame = s->nb_frame + 1;
  if (s->is_decoded != 0) {
    if (((byte)h265d_debug & 0x40) != 0) {
      _mpp_log_l(4,"H265D_PARSER","Decoded frame with POC %d.\n",(char *)0x0,(ulong)(uint)s->poc);
    }
    s->is_decoded = 0;
  }
  mpp_hevc_output_frame(*ctx,(int)*(undefined8 *)((long)ctx + 0x50));
  return MPP_OK;
}

Assistant:

MPP_RET h265d_parse(void *ctx, HalDecTask *task)
{
    MPP_RET ret;
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    HEVCContext *s = h265dctx->priv_data;

    task->valid = 0;
    s->got_frame = 0;
    s->task = task;
    s->ref = NULL;
    ret    = parser_nal_units(s);
    if (ret < 0) {
        if (ret ==  MPP_ERR_STREAM) {
            mpp_log("current stream is no right skip it %p\n", s->ref);
            ret = 0;
        }
        // return ret;
        task->flags.parse_err = 1;
    }
    h265d_dbg(H265D_DBG_GLOBAL, "decode poc = %d", s->poc);
    if (s->ref) {
        if (!task->flags.parse_err)
            h265d_parser2_syntax(h265dctx);

        s->task->syntax.data = s->hal_pic_private;
        s->task->syntax.number = 1;
        s->task->valid = 1;
        s->ps_need_upate = 0;
    }
    if (s->eos) {
        h265d_flush(ctx);
        s->task->flags.eos = 1;
    }
    s->nb_frame++;
    if (s->is_decoded) {
        h265d_dbg(H265D_DBG_GLOBAL, "Decoded frame with POC %d.\n", s->poc);
        s->is_decoded = 0;
    }
    mpp_hevc_output_frame(ctx, 0);
    return MPP_OK;
}